

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

void Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1model_1set
               (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_,jstring jarg2)

{
  size_t sVar1;
  void *pvVar2;
  long in_RDX;
  long in_R8;
  char *arg2;
  opt_s *arg1;
  jstring in_stack_ffffffffffffffb8;
  JNIEnv_ *in_stack_ffffffffffffffc0;
  JNIEnv_ *this;
  char *local_38;
  
  local_38 = (char *)0x0;
  if ((in_R8 == 0) ||
     (local_38 = JNIEnv_::GetStringUTFChars
                           (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(jboolean *)0x11a7ed
                           ), local_38 != (char *)0x0)) {
    this = *(JNIEnv_ **)(in_RDX + 0x38);
    if (this != (JNIEnv_ *)0x0) {
      operator_delete__(this);
    }
    if (local_38 == (char *)0x0) {
      *(undefined8 *)(in_RDX + 0x38) = 0;
    }
    else {
      sVar1 = strlen(local_38);
      pvVar2 = operator_new__(sVar1 + 1);
      *(void **)(in_RDX + 0x38) = pvVar2;
      strcpy(*(char **)(in_RDX + 0x38),local_38);
      JNIEnv_::ReleaseStringUTFChars(this,in_stack_ffffffffffffffb8,(char *)0x11a887);
    }
  }
  return;
}

Assistant:

SWIGEXPORT void JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1model_1set(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_, jstring jarg2) {
  opt_s *arg1 = (opt_s *) 0 ;
  char *arg2 = (char *) 0 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  arg2 = 0;
  if (jarg2) {
    arg2 = (char *)jenv->GetStringUTFChars(jarg2, 0);
    if (!arg2) return ;
  }
  {
    delete [] arg1->model;
    if (arg2) {
      arg1->model = (char *) (new char[strlen((const char *)arg2)+1]);
      strcpy((char *)arg1->model, (const char *)arg2);
    } else {
      arg1->model = 0;
    }
  }
  if (arg2) jenv->ReleaseStringUTFChars(jarg2, (const char *)arg2);
}